

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O0

AEStackFrame __thiscall moira::Moira::makeFrame<0ul>(Moira *this,u32 addr,u32 pc)

{
  u32 in_EDX;
  u32 in_ESI;
  Moira *in_RDI;
  AEStackFrame AVar1;
  u32 uVar2;
  u32 uVar3;
  
  uVar2 = in_EDX;
  uVar3 = in_ESI;
  getSR((Moira *)0x2dc8a0);
  getIRD(in_RDI);
  AVar1 = makeFrame<0ul>((Moira *)CONCAT44(uVar3,uVar2),in_EDX,in_ESI,(u16)((ulong)in_RDI >> 0x30),
                         (u16)((ulong)in_RDI >> 0x20));
  return AVar1;
}

Assistant:

AEStackFrame
Moira::makeFrame(u32 addr, u32 pc)
{
    return makeFrame <F> (addr, pc, getSR(), getIRD());
}